

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

Var BailOutRecord::BailOutForElidedYield(void *framePointer)

{
  Utf8SourceInfo *pUVar1;
  ThreadContext *this;
  RegSlot localRegisterID;
  JavascriptCallStackLayout *pJVar2;
  FunctionBody *this_00;
  Var pvVar3;
  DynamicProfileInfo *this_01;
  byte bVar4;
  undefined8 unaff_retaddr;
  long local_58;
  JavascriptGenerator *generator;
  PushPopFrameHelper pushPopFrameHelper;
  
  pJVar2 = Js::JavascriptCallStackLayout::FromFramePointer(framePointer);
  this_00 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar2);
  pUVar1 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  bVar4 = pUVar1->field_0xa8;
  if ((pUVar1->debugModeSource).ptr == (uchar *)0x0 && (bVar4 & 0x20) == 0) {
    bVar4 = 0;
  }
  else {
    bVar4 = (bVar4 & 0x40) >> 6;
  }
  local_58 = *(long *)(pJVar2 + 0x10);
  this = *(ThreadContext **)(local_58 + 0x20);
  pushPopFrameHelper._16_8_ = *(undefined8 *)(this->X86_TEMP_SIMD[1].field_0.i64[1] + 0x3b8);
  localRegisterID = Js::FunctionBody::GetYieldRegister(this_00);
  Js::InterpreterStackFrame::SetNonVarReg
            ((InterpreterStackFrame *)this,localRegisterID,*(Var *)(pJVar2 + 0x18));
  this->m_remoteThreadContextInfo = &local_58;
  Js::FunctionBody::BeginExecution(this_00);
  generator = *(JavascriptGenerator **)(this->X86_TEMP_SIMD[1].field_0.i64[1] + 0x3b8);
  pushPopFrameHelper.m_interpreterFrame._0_1_ = 0;
  *(undefined8 *)&this->noScriptScope = unaff_retaddr;
  this->debugManager = (DebugManager *)register0x00000020;
  pushPopFrameHelper.m_threadContext = this;
  if ((*(byte *)(this->X86_TEMP_SIMD[2].field_0.i64[1] + 0x46) & 2) == 0) {
    ThreadContext::PushInterpreterFrame((ThreadContext *)generator,(InterpreterStackFrame *)this);
  }
  else {
    pushPopFrameHelper.m_interpreterFrame._0_1_ = 1;
  }
  if (bVar4 == 0) {
    pvVar3 = Js::InterpreterStackFrame::Process((InterpreterStackFrame *)this);
  }
  else {
    pvVar3 = Js::InterpreterStackFrame::DebugProcess((InterpreterStackFrame *)this);
  }
  Js::InterpreterStackFrame::PushPopFrameHelper::~PushPopFrameHelper
            ((PushPopFrameHelper *)&generator);
  Js::FunctionBody::EndExecution(this_00);
  if ((this_00->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    this_01 = Js::FunctionBody::GetAnyDynamicProfileInfo(this_00);
    Js::DynamicProfileInfo::RecordImplicitCallFlags
              (this_01,*(ImplicitCallFlags *)(pushPopFrameHelper._16_8_ + 0x1570));
  }
  return pvVar3;
}

Assistant:

Js::Var BailOutRecord::BailOutForElidedYield(void * framePointer)
{
    JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(NoSaveRegistersBailOutForElidedYield);
    Js::JavascriptCallStackLayout * const layout = Js::JavascriptCallStackLayout::FromFramePointer(framePointer);
    Js::ScriptFunction ** functionRef = (Js::ScriptFunction **)&layout->functionObject;
    Js::ScriptFunction * function = *functionRef;
    Js::FunctionBody * executeFunction = function->GetFunctionBody();
#ifdef ENABLE_SCRIPT_DEBUGGING
    bool isInDebugMode = executeFunction->IsInDebugMode();
#endif

    Js::JavascriptGenerator* generator = static_cast<Js::JavascriptGenerator*>(layout->args[0]);
    Js::InterpreterStackFrame* frame = generator->GetFrame();
    ThreadContext *threadContext = frame->GetScriptContext()->GetThreadContext();

    frame->SetNonVarReg(executeFunction->GetYieldRegister(), layout->args[1]);

    // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
    // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
    frame->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);

    executeFunction->BeginExecution();

    Js::Var aReturn = nullptr;

    {
        // Following _AddressOfReturnAddress <= real address of "returnAddress". Suffices for RemoteStackWalker to test partially initialized interpreter frame.
        Js::InterpreterStackFrame::PushPopFrameHelper pushPopFrameHelper(frame, _ReturnAddress(), _AddressOfReturnAddress());
#ifdef ENABLE_SCRIPT_DEBUGGING
        aReturn = isInDebugMode ? frame->DebugProcess() : frame->Process();
#else
        aReturn = frame->Process();
#endif
        // Note: in debug mode we always have to bailout to debug thunk,
        //       as normal interpreter thunk expects byte code compiled w/o debugging.
    }

    executeFunction->EndExecution();

    if (executeFunction->HasDynamicProfileInfo())
    {
        Js::DynamicProfileInfo *dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
    }

    return aReturn;
    JIT_HELPER_END(NoSaveRegistersBailOutForElidedYield);
}